

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O2

void __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Set
          (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this,
          ArenaAllocator *allocator,Char kc,unsigned_long v)

{
  Inner *this_00;
  undefined6 in_register_00000012;
  
  if ((ushort)kc < 0x100) {
    BVStatic<256UL>::Set(&this->isInMap,(BVIndex)CONCAT62(in_register_00000012,kc));
    this->directMap[(ushort)kc] = v;
    return;
  }
  this_00 = (Inner *)this->root;
  if (this_00 == (Inner *)0x0) {
    if (this->defv == v) {
      return;
    }
    this_00 = (Inner *)new<Memory::ArenaAllocator>(0x88,allocator,0x35916e);
    Inner::Inner(this_00);
    this->root = (Type)this_00;
  }
  (*(this_00->super_Node)._vptr_Node[1])
            (this_00,allocator,this->defv,3,CONCAT62(in_register_00000012,kc) & 0xffffffff,v);
  return;
}

Assistant:

void Set(ArenaAllocator* allocator, Char kc, V v)
        {
            uint k = CTU(kc);
            if (k < directSize)
            {
                isInMap.Set(k);
                directMap[k] = v;
            }
            else
            {
                if (root == 0)
                {
                    if (v == defv)
                        return;
                    root = Anew(allocator, Inner);
                }
                root->Set(allocator, defv, levels - 1, k, v);
            }
        }